

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ActivationParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_activation(NeuralNetworkLayer *this)

{
  ActivationParams *this_00;
  
  if (this->_oneof_case_[0] != 0x82) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x82;
    this_00 = (ActivationParams *)operator_new(0x20);
    ActivationParams::ActivationParams(this_00);
    (this->layer_).activation_ = this_00;
  }
  return (ActivationParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ActivationParams* NeuralNetworkLayer::mutable_activation() {
  if (!has_activation()) {
    clear_layer();
    set_has_activation();
    layer_.activation_ = new ::CoreML::Specification::ActivationParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.activation)
  return layer_.activation_;
}